

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::FramebufferVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
          (RefCntAutoPtr<Diligent::FramebufferVkImpl> *this,FramebufferVkImpl *pObj)

{
  FramebufferVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::FramebufferVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (FramebufferVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ::Release((DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (FramebufferVkImpl *)0x0) {
      RefCountedObject<Diligent::IFramebufferVk>::AddRef
                ((RefCountedObject<Diligent::IFramebufferVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }